

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_10b7e5d::FreeDesktopTrashOperation::tryCreateInfoFile
          (FreeDesktopTrashOperation *this,QString *filePath,QSystemError *error)

{
  int __fd;
  undefined1 *puVar1;
  QArrayData *pQVar2;
  int iVar3;
  int *piVar4;
  uint *puVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QByteArray local_88;
  QStringBuilder<QByteArray,_const_char_(&)[11]> local_68;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit_helper(&local_88,(QChar *)(filePath->d).ptr,(filePath->d).size);
  local_68.a.d.size = local_88.d.size;
  local_68.a.d.ptr = local_88.d.ptr;
  local_68.a.d.d = local_88.d.d;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char *)0x0;
  local_88.d.size = 0;
  local_68.b = (char (*) [11])0x59252e;
  QStringBuilder<QByteArray,_const_char_(&)[11]>::convertTo<QByteArray>(&local_48,&local_68);
  if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  pcVar6 = local_48.d.ptr;
  if (local_48.d.ptr == (char *)0x0) {
    pcVar6 = "";
  }
  __fd = this->infoDirFd;
  do {
    iVar3 = openat(__fd,pcVar6,0x800c2,0x1b6);
    if (iVar3 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  this->infoFileFd = iVar3;
  if (iVar3 < 0) {
    puVar5 = (uint *)__errno_location();
    *error = (QSystemError)((ulong)*puVar5 | 0x100000000);
  }
  else {
    pQVar2 = &((this->infoFilePath).d.d)->super_QArrayData;
    pcVar6 = (this->infoFilePath).d.ptr;
    (this->infoFilePath).d.d = local_48.d.d;
    (this->infoFilePath).d.ptr = local_48.d.ptr;
    puVar1 = (undefined1 *)(this->infoFilePath).d.size;
    (this->infoFilePath).d.size = local_48.d.size;
    local_48.d.d = (Data *)pQVar2;
    local_48.d.ptr = pcVar6;
    local_48.d.size = (qsizetype)puVar1;
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return -1 < iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool tryCreateInfoFile(const QString &filePath, QSystemError &error)
    {
        QByteArray p = QFile::encodeName(filePath) + ".trashinfo";
        infoFileFd = qt_safe_openat(infoDirFd, p, QT_OPEN_RDWR | QT_OPEN_CREAT | QT_OPEN_EXCL, 0666);
        if (infoFileFd < 0) {
            error = QSystemError(errno, QSystemError::StandardLibraryError);
            return false;
        }
        infoFilePath = std::move(p);
        return true;
    }